

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O1

int32 vector_normalize(vector_t v,uint32 dim)

{
  ulong uVar1;
  double dVar2;
  
  dVar2 = 0.0;
  if (dim != 0) {
    uVar1 = 0;
    do {
      dVar2 = dVar2 + (double)(float)v[uVar1];
      uVar1 = uVar1 + 1;
    } while (dim != uVar1);
  }
  if ((dVar2 == 0.0) && (!NAN(dVar2))) {
    return -2;
  }
  if (dim != 0) {
    uVar1 = 0;
    do {
      v[uVar1] = (float32)((float)v[uVar1] / (float)dVar2);
      uVar1 = uVar1 + 1;
    } while (dim != uVar1);
    return 0;
  }
  return 0;
}

Assistant:

int
vector_normalize(vector_t v, uint32 dim)
{
    uint32 i;
    float64 s;
    int ret_val = S3_SUCCESS;

    for (i = 0, s = 0; i < dim; i++)
        s += v[i];

    if (s != 0) {
        for (i = 0; i < dim; i++)
            v[i] /= (float) s;
    }
    else {
        ret_val = S3_WARNING;
    }

    return ret_val;
}